

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

int __thiscall QAccessibleMenuBar::childCount(QAccessibleMenuBar *this)

{
  QWidget *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &menuBar(this)->super_QWidget;
  QWidget::actions((QList<QAction_*> *)&local_30,this_00);
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)local_30.size;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMenuBar::childCount() const
{
    return menuBar()->actions().size();
}